

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O1

bool __thiscall BasePort::SetProtocol(BasePort *this,ProtocolType prot)

{
  long *plVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  bool bVar5;
  
  if (prot == PROTOCOL_SEQ_RW) {
LAB_00114faf:
    poVar2 = this->outStr;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"BasePort::SetProtocol: system running in NON broadcast mode",0x3b);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    this->Protocol_ = PROTOCOL_SEQ_RW;
LAB_00114ff5:
    bVar5 = this->Protocol_ == prot;
  }
  else {
    if (this->IsAllBoardsBroadcastCapable_ == false) {
      poVar2 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"BasePort::SetProtocol",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      poVar2 = (ostream *)std::ostream::flush();
      pcVar4 = "***Error: not all boards support broadcasting, ";
      lVar3 = 0x2f;
    }
    else {
      if (((this->IsAllBoardsRev4_6_ != false) || (this->IsAllBoardsRev7_ != false)) ||
         (this->IsAllBoardsRev8_9_ != false)) {
        if (prot == PROTOCOL_BC_QRW) {
          poVar2 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,
                     "BasePort::SetProtocol: system running with broadcast query, read, and write",
                     0x4b);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          this->Protocol_ = PROTOCOL_BC_QRW;
        }
        else if (prot == PROTOCOL_SEQ_R_BC_W) {
          poVar2 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"BasePort::SetProtocol: system running with broadcast write",0x3a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
          std::ostream::put((char)poVar2);
          std::ostream::flush();
          this->Protocol_ = PROTOCOL_SEQ_R_BC_W;
        }
        else {
          if (prot == PROTOCOL_SEQ_RW) goto LAB_00114faf;
          poVar2 = this->outStr;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar2,"BasePort::SetProtocol: warning: unknown protocol (ignored): ",0x3c);
          plVar1 = (long *)std::ostream::operator<<((ostream *)poVar2,prot);
          std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
          std::ostream::put((char)plVar1);
          std::ostream::flush();
        }
        goto LAB_00114ff5;
      }
      poVar2 = this->outStr;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"BasePort::SetProtocol",0x15);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      poVar2 = (ostream *)std::ostream::flush();
      pcVar4 = "***Error: cannot use broadcast mode with this mix of firmware, ";
      lVar3 = 0x3f;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar4,lVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    poVar2 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"          please upgrade your firmware",0x26);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool BasePort::SetProtocol(ProtocolType prot) {
    if (prot != BasePort::PROTOCOL_SEQ_RW) {
        if (!IsAllBoardsBroadcastCapable_) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: not all boards support broadcasting, " << std::endl
                   << "          please upgrade your firmware"  << std::endl;
            return false;
        }
        if (!IsBroadcastFirmwareMixValid()) {
            outStr << "BasePort::SetProtocol" << std::endl
                   << "***Error: cannot use broadcast mode with this mix of firmware, " << std::endl
                   << "          please upgrade your firmware" << std::endl;
            return false;
        }
    }
    switch (prot) {
        case BasePort::PROTOCOL_SEQ_RW:
            outStr << "BasePort::SetProtocol: system running in NON broadcast mode" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_SEQ_R_BC_W:
            outStr << "BasePort::SetProtocol: system running with broadcast write" << std::endl;
            Protocol_ = prot;
            break;
        case BasePort::PROTOCOL_BC_QRW:
            outStr << "BasePort::SetProtocol: system running with broadcast query, read, and write" << std::endl;
            Protocol_ = prot;
            break;
        default:
            outStr << "BasePort::SetProtocol: warning: unknown protocol (ignored): " << prot << std::endl;
            break;
    }
    return (Protocol_ == prot);
}